

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestIsInitialized_SubMessage::_InternalSerialize
          (TestIsInitialized_SubMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32_t *puVar2;
  uint8_t *target_00;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestIsInitialized_SubMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestIsInitialized_SubMessage *this_local;
  
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if ((*puVar2 & 1) != 0) {
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (1,(MessageLite *)(this->field_0)._impl_.subgroup_,target_00,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestIsInitialized_SubMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestIsInitialized_SubMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestIsInitialized.SubMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.TestIsInitialized.SubMessage.SubGroup subgroup = 1 [features = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        1, *this_._impl_.subgroup_, target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestIsInitialized.SubMessage)
  return target;
}